

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int pool_bulk_remove(StringPool *pool,xmlHashTablePtr hash,size_t num)

{
  xmlChar **ppxVar1;
  size_t sVar2;
  int local_44;
  int res;
  xmlChar **str;
  ulong uStack_30;
  int ret;
  size_t j;
  size_t i;
  size_t num_local;
  xmlHashTablePtr hash_local;
  StringPool *pool_local;
  
  str._4_4_ = 0;
  j = pool->index;
  uStack_30 = 0;
  for (; j < pool->num_strings && uStack_30 < num; j = pool->num_keys + j) {
    ppxVar1 = pool->strings + j;
    local_44 = -1;
    sVar2 = pool->num_keys;
    if (sVar2 == 1) {
      local_44 = xmlHashRemoveEntry(hash,*ppxVar1,0);
    }
    else if (sVar2 == 2) {
      local_44 = xmlHashRemoveEntry2(hash,*ppxVar1,ppxVar1[1],0);
    }
    else if (sVar2 == 3) {
      local_44 = xmlHashRemoveEntry3(hash,*ppxVar1,ppxVar1[1],ppxVar1[2],0);
    }
    if (local_44 != 0) {
      str._4_4_ = -1;
    }
    uStack_30 = uStack_30 + 1;
  }
  pool->index = j;
  return str._4_4_;
}

Assistant:

static int
pool_bulk_remove(StringPool *pool, xmlHashTablePtr hash, size_t num) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar **str = &pool->strings[i];
        int res = -1;

        switch (pool->num_keys) {
            case 1:
                res = xmlHashRemoveEntry(hash, str[0], NULL);
                break;
            case 2:
                res = xmlHashRemoveEntry2(hash, str[0], str[1], NULL);
                break;
            case 3:
                res = xmlHashRemoveEntry3(hash, str[0], str[1], str[2], NULL);
                break;
        }

        if (res != 0)
            ret = -1;

        i += pool->num_keys;
    }

    pool->index = i;
    return ret;
}